

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O2

bool __thiscall restincurl::Signaler::WasSignalled(Signaler *this)

{
  bool bVar1;
  ulong in_RAX;
  ssize_t sVar2;
  bool bVar3;
  ulong uStack_28;
  char byte;
  
  uStack_28 = in_RAX & 0xffffffffffffff;
  bVar1 = false;
  do {
    bVar3 = bVar1;
    sVar2 = read((this->pipefd_)._M_elems[0],&byte,1);
    bVar1 = true;
  } while (0 < sVar2);
  return bVar3;
}

Assistant:

bool WasSignalled() {
            bool rval = false;
            char byte = {};
            while(read(pipefd_[FD_READ], &byte, 1) > 0) {
                RESTINCURL_LOG_TRACE("Signal: Was signalled");
                rval = true;
            }

            return rval;
        }